

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oscurses.cc
# Opt level: O1

void os_expause(void)

{
  if ((globalApp->options).exitPause == true) {
    os_printz("[Hit any key to exit.]");
    (*globalApp->_vptr_FrobTadsApplication[4])();
    (*globalApp->_vptr_FrobTadsApplication[8])(globalApp,0,0xffffffff);
    return;
  }
  return;
}

Assistant:

void
os_expause( void )
{
    if (globalApp->options.exitPause) {
        // Exit-pause is enabled.  Tell the user, flush any
        // pending output and wait for a key.
        os_printz("[Hit any key to exit.]");
        os_flush();
        os_waitc();
    }
}